

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_msgpack.hpp
# Opt level: O3

type jsoncons::msgpack::
     encode_msgpack<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *j,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *cont,
               msgpack_encode_options *options)

{
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>,_void>
  adaptor;
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  encoder;
  basic_json_visitor<char> local_68;
  undefined ***local_60;
  undefined **local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  void *local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  
  local_60 = &local_58;
  local_58 = &PTR__basic_msgpack_encoder_00b2efb8;
  local_38 = *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_msgpack_encode_options[-3]);
  local_48 = 0xb2ef38;
  local_40 = 0xb2ef60;
  local_28 = (void *)0x0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_18 = 0;
  uStack_14 = 0;
  uStack_10 = 0;
  local_68._vptr_basic_json_visitor = (_func_int **)&PTR__basic_json_visitor_00b46670;
  local_50 = cont;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::dump(j,&local_68);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,CONCAT44(uStack_14,local_18) - (long)local_28);
  }
  return;
}

Assistant:

typename std::enable_if<!ext_traits::is_basic_json<T>::value &&
                            ext_traits::is_back_insertable_byte_container<ByteContainer>::value,void>::type 
    encode_msgpack(const allocator_set<Allocator,TempAllocator>& alloc_set, 
                   const T& val, ByteContainer& cont, 
                   const msgpack_encode_options& options = msgpack_encode_options())
    {
        basic_msgpack_encoder<jsoncons::bytes_sink<ByteContainer>,TempAllocator> encoder(cont, options, alloc_set.get_temp_allocator());
        std::error_code ec;
        encode_traits<T,char>::encode(val, encoder, json(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
    }